

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Type_create_hvector
              (int count,int blocklength,MPIABI_Aint stride,MPIABI_Datatype oldtype,
              MPIABI_Datatype *newtype)

{
  int iVar1;
  
  iVar1 = MPI_Type_create_hvector();
  return iVar1;
}

Assistant:

int MPIABI_Type_create_hvector(
  int count,
  int blocklength,
  MPIABI_Aint stride,
  MPIABI_Datatype oldtype,
  MPIABI_Datatype * newtype
) {
  return MPI_Type_create_hvector(
    count,
    blocklength,
    (MPI_Aint)(WPI_Aint)stride,
    (MPI_Datatype)(WPI_Datatype)oldtype,
    (MPI_Datatype *)(WPI_DatatypePtr)newtype
  );
}